

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O2

void GameLoop::startSingle(bool demoMode)

{
  bool bVar1;
  int iVar2;
  Map *this;
  ostream *poVar3;
  vector<Player_*,_std::allocator<Player_*>_> *playerList;
  Deck *this_00;
  GameLoop *pGVar4;
  MapLoader *pMVar5;
  AlternativeLoader altLoader;
  _Vector_base<char,_std::allocator<char>_> local_a8;
  string mapToLoad;
  string local_70;
  MapLoader myLoader;
  
  std::operator<<((ostream *)&std::cout,
                  "____    __    ____  _______  __        ______   ______   .___  ___.  _______    .___________.  ______      .______       __       _______. __  ___  __  \n\\   \\  /  \\  /   / |   ____||  |      /      | /  __  \\  |   \\/   | |   ____|   |           | /  __  \\     |   _  \\     |  |     /       ||  |/  / |  | \n \\   \\/    \\/   /  |  |__   |  |     |  ,----\'|  |  |  | |  \\  /  | |  |__      `---|  |----`|  |  |  |    |  |_)  |    |  |    |   (----`|  \'  /  |  | \n  \\            /   |   __|  |  |     |  |     |  |  |  | |  |\\/|  | |   __|         |  |     |  |  |  |    |      /     |  |     \\   \\    |    <   |  | \n   \\    /\\    /    |  |____ |  `----.|  `----.|  `--\'  | |  |  |  | |  |____        |  |     |  `--\'  |    |  |\\  \\----.|  | .----)   |   |  .  \\  |__| \n    \\__/  \\__/     |_______||_______| \\______| \\______/  |__|  |__| |_______|       |__|      \\______/     | _| `._____||__| |_______/    |__|\\__\\ (__) \n                                                                                                                                                        \n\n"
                 );
  mapToLoad._M_dataplus._M_p = (pointer)&mapToLoad.field_2;
  mapToLoad._M_string_length = 0;
  mapToLoad.field_2._M_local_buf[0] = '\0';
  do {
    chooseMap_abi_cxx11_();
    pMVar5 = &myLoader;
    std::__cxx11::string::operator=((string *)&mapToLoad,(string *)&myLoader);
    iVar2 = (int)pMVar5;
    std::__cxx11::string::~string((string *)&myLoader);
    iVar2 = choosePlayerNumber(6,iVar2);
    std::__cxx11::string::string((string *)&local_70,(string *)&mapToLoad);
    MapLoader::MapLoader(&myLoader,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    this = MapLoader::readMapFile(&myLoader);
    if (this == (Map *)0x0) {
      AlternativeLoader::AlternativeLoader(&altLoader,&mapToLoad);
      this = AlternativeLoader::altReadMapFile(&altLoader);
      AlternativeLoader::~AlternativeLoader(&altLoader);
      if (this != (Map *)0x0) goto LAB_0010eadf;
      this = (Map *)0x0;
LAB_0010eb5f:
      std::operator<<((ostream *)&std::cout,
                      "There was an error loading the game board. Try another mapfile.\n");
LAB_0010eb72:
      bVar1 = false;
    }
    else {
LAB_0010eadf:
      bVar1 = Map::testConnected(this);
      if (!bVar1) goto LAB_0010eb5f;
      bVar1 = true;
      if ((int)((ulong)((long)(this->pMapCountries->
                              super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->pMapCountries->
                             super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                             _M_impl.super__Vector_impl_data._M_start) >> 3) < iVar2) {
        poVar3 = std::operator<<((ostream *)&std::cout,"The selected map with ");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3," cannot support ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
        poVar3 = std::operator<<(poVar3," players. Please try again.");
        std::endl<char,std::char_traits<char>>(poVar3);
        goto LAB_0010eb72;
      }
    }
    MapLoader::~MapLoader(&myLoader);
    if (bVar1) {
      local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      playerList = initPlayers(iVar2,this,(vector<char,_std::allocator<char>_> *)&local_a8);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_a8);
      this_00 = (Deck *)operator_new(0x18);
      Deck::Deck(this_00,(int)((ulong)((long)(this->pMapCountries->
                                             super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->pMapCountries->
                                            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                            )._M_impl.super__Vector_impl_data._M_start) >> 3));
      Deck::createDeck(this_00);
      Map::printMap(this);
      initInstance(this,playerList,this_00);
      if (!demoMode) {
        pGVar4 = getInstance();
        distributeArmies(pGVar4);
        pGVar4 = getInstance();
        loop(pGVar4,-1);
        resetInstance();
      }
      std::operator<<((ostream *)&std::cout,
                      "\n.___________. __    __       ___      .__   __.  __  ___      _______.    _______   ______   .______         .______    __          ___   ____    ____  __  .__   __.   _______  __  \n|           ||  |  |  |     /   \\     |  \\ |  | |  |/  /     /       |   |   ____| /  __  \\  |   _  \\        |   _  \\  |  |        /   \\  \\   \\  /   / |  | |  \\ |  |  /  _____||  | \n`---|  |----`|  |__|  |    /  ^  \\    |   \\|  | |  \'  /     |   (----`   |  |__   |  |  |  | |  |_)  |       |  |_)  | |  |       /  ^  \\  \\   \\/   /  |  | |   \\|  | |  |  __  |  | \n    |  |     |   __   |   /  /_\\  \\   |  . `  | |    <       \\   \\       |   __|  |  |  |  | |      /        |   ___/  |  |      /  /_\\  \\  \\_    _/   |  | |  . `  | |  | |_ | |  | \n    |  |     |  |  |  |  /  _____  \\  |  |\\   | |  .  \\  .----)   |      |  |     |  `--\'  | |  |\\  \\----.   |  |      |  `----./  _____  \\   |  |     |  | |  |\\   | |  |__| | |__| \n    |__|     |__|  |__| /__/     \\__\\ |__| \\__| |__|\\__\\ |_______/       |__|      \\______/  | _| `._____|   | _|      |_______/__/     \\__\\  |__|     |__| |__| \\__|  \\______| (__) \n                                                                                                                                                                                     "
                     );
      std::__cxx11::string::~string((string *)&mapToLoad);
      return;
    }
  } while( true );
}

Assistant:

void GameLoop::startSingle(bool demoMode) {

    std::cout
            << "____    __    ____  _______  __        ______   ______   .___  ___.  _______    .___________.  ______      .______       __       _______. __  ___  __  \n"
               "\\   \\  /  \\  /   / |   ____||  |      /      | /  __  \\  |   \\/   | |   ____|   |           | /  __  \\     |   _  \\     |  |     /       ||  |/  / |  | \n"
               " \\   \\/    \\/   /  |  |__   |  |     |  ,----'|  |  |  | |  \\  /  | |  |__      `---|  |----`|  |  |  |    |  |_)  |    |  |    |   (----`|  '  /  |  | \n"
               "  \\            /   |   __|  |  |     |  |     |  |  |  | |  |\\/|  | |   __|         |  |     |  |  |  |    |      /     |  |     \\   \\    |    <   |  | \n"
               "   \\    /\\    /    |  |____ |  `----.|  `----.|  `--'  | |  |  |  | |  |____        |  |     |  `--'  |    |  |\\  \\----.|  | .----)   |   |  .  \\  |__| \n"
               "    \\__/  \\__/     |_______||_______| \\______| \\______/  |__|  |__| |_______|       |__|      \\______/     | _| `._____||__| |_______/    |__|\\__\\ (__) \n"
               "                                                                                                                                                        \n\n";

    std::string mapToLoad;
    int numberOfPlayers;
    Map* gameMap;
    do {
        mapToLoad = chooseMap();
        numberOfPlayers = choosePlayerNumber(2, 6);
        MapLoader myLoader = MapLoader(mapToLoad);
        gameMap = myLoader.readMapFile();

        if (gameMap == nullptr) {
            AlternativeLoader altLoader = AlternativeLoader(mapToLoad);
            gameMap = altLoader.altReadMapFile();
        }
        if (gameMap == nullptr || !gameMap->testConnected()) {
            cout << "There was an error loading the game board. Try another mapfile.\n";
            continue;
        } else if (int(gameMap->getMapCountries()->size()) < numberOfPlayers) {
            std::cout << "The selected map with " << gameMap->getMapCountries()->size() << " cannot support "
                      << numberOfPlayers << " players. Please try again." << std::endl;
        } else {
            break;
        }
    } while (true);

    std::vector<Player*>* gamePlayers = initPlayers(numberOfPlayers, gameMap);
    Deck* gameDeck = new Deck(gameMap->getMapCountries()->size());
    gameDeck->createDeck();
    gameMap->printMap();

    GameLoop::initInstance(gameMap, gamePlayers, gameDeck);

    if (!demoMode) {
        GameLoop::getInstance()->distributeArmies();
        GameLoop::getInstance()->loop();
        GameLoop::resetInstance();
    }

    std::cout << "\n"
                 ".___________. __    __       ___      .__   __.  __  ___      _______.    _______   ______   .______         .______    __          ___   ____    ____  __  .__   __.   _______  __  \n"
                 "|           ||  |  |  |     /   \\     |  \\ |  | |  |/  /     /       |   |   ____| /  __  \\  |   _  \\        |   _  \\  |  |        /   \\  \\   \\  /   / |  | |  \\ |  |  /  _____||  | \n"
                 "`---|  |----`|  |__|  |    /  ^  \\    |   \\|  | |  '  /     |   (----`   |  |__   |  |  |  | |  |_)  |       |  |_)  | |  |       /  ^  \\  \\   \\/   /  |  | |   \\|  | |  |  __  |  | \n"
                 "    |  |     |   __   |   /  /_\\  \\   |  . `  | |    <       \\   \\       |   __|  |  |  |  | |      /        |   ___/  |  |      /  /_\\  \\  \\_    _/   |  | |  . `  | |  | |_ | |  | \n"
                 "    |  |     |  |  |  |  /  _____  \\  |  |\\   | |  .  \\  .----)   |      |  |     |  `--'  | |  |\\  \\----.   |  |      |  `----./  _____  \\   |  |     |  | |  |\\   | |  |__| | |__| \n"
                 "    |__|     |__|  |__| /__/     \\__\\ |__| \\__| |__|\\__\\ |_______/       |__|      \\______/  | _| `._____|   | _|      |_______/__/     \\__\\  |__|     |__| |__| \\__|  \\______| (__) \n"
                 "                                                                                                                                                                                     ";
}